

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

bool duckdb::BoundCastExpression::CastIsInvertible
               (LogicalType *source_type,LogicalType *target_type)

{
  LogicalTypeId LVar1;
  LogicalTypeId LVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  uint8_t target_scale;
  uint8_t source_scale;
  uint8_t target_width;
  uint8_t source_width;
  byte local_c;
  byte local_b;
  uint8_t local_a;
  uint8_t local_9;
  
  LVar1 = source_type->id_;
  if (LVar1 == BOOLEAN) {
    bVar6 = 0;
    goto LAB_015dd2e4;
  }
  LVar2 = target_type->id_;
  bVar3 = 0;
  bVar6 = 0;
  if ((((LVar2 == DOUBLE) || (LVar1 == DOUBLE)) || (bVar6 = bVar3, LVar2 == FLOAT)) ||
     ((LVar1 == FLOAT || (LVar2 == BOOLEAN)))) goto LAB_015dd2e4;
  if (LVar1 == DECIMAL || LVar2 == DECIMAL) {
    bVar4 = LogicalType::GetDecimalProperties(source_type,&local_9,&local_b);
    if ((bVar4) && (bVar4 = LogicalType::GetDecimalProperties(target_type,&local_a,&local_c), bVar4)
       ) {
      bVar6 = local_b <= local_c;
      goto LAB_015dd2e4;
    }
    goto switchD_015dd2c6_caseD_f;
  }
  uVar5 = (uint)LVar1;
  if (uVar5 < 0x25) {
    if ((0x1001e0000U >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
      switch(LVar2) {
      case DATE:
      case TIME:
      case TIME_TZ:
        goto switchD_015dd2c6_caseD_f;
      case TIMESTAMP_SEC:
        bVar6 = LVar1 < TIMESTAMP_MS;
        break;
      case TIMESTAMP_MS:
        bVar6 = LVar1 < TIMESTAMP;
        break;
      case TIMESTAMP:
        bVar6 = LVar1 < TIMESTAMP_NS;
        break;
      case TIMESTAMP_NS:
        bVar6 = LVar1 < DECIMAL;
        break;
      default:
        goto switchD_015dd2c6_caseD_15;
      case VARCHAR:
        goto switchD_015dd2c6_caseD_19;
      case TIMESTAMP_TZ:
        bVar6 = uVar5 == 0x20;
      }
      goto LAB_015dd2e4;
    }
    if ((0x1402000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_015dd2e7;
  }
  else {
LAB_015dd2e7:
    if (LVar2 != VARCHAR) {
switchD_015dd2c6_caseD_15:
      bVar6 = 1;
      goto LAB_015dd2e4;
    }
switchD_015dd2c6_caseD_19:
    if (LVar1 < (TIME_TZ|SQLNULL)) {
      bVar6 = (byte)(0x5001f8000 >> (LVar1 & (TIMESTAMP_TZ|UBIGINT)));
      goto LAB_015dd2e4;
    }
  }
switchD_015dd2c6_caseD_f:
  bVar6 = 0;
LAB_015dd2e4:
  return (bool)(bVar6 & 1);
}

Assistant:

inline LogicalTypeId id() const { // NOLINT: mimic std casing
		return id_;
	}